

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O0

void __thiscall wasm::I64ToI32Lowering::visitCallIndirect(I64ToI32Lowering *this,CallIndirect *curr)

{
  CallIndirect *curr_00;
  bool local_1f9;
  anon_class_16_2_3efcb345 local_1f8;
  BuilderFunc<wasm::CallIndirect> local_1e8;
  Fatal local_1b8;
  BasicType local_2c;
  Signature local_28;
  CallIndirect *local_18;
  CallIndirect *curr_local;
  I64ToI32Lowering *this_local;
  
  local_1f9 = false;
  local_18 = curr;
  curr_local = (CallIndirect *)this;
  if ((curr->isReturn & 1U) != 0) {
    local_28 = HeapType::getSignature(&curr->heapType);
    local_2c = i64;
    local_1f9 = wasm::Type::operator==(&local_28.results,&local_2c);
  }
  curr_00 = local_18;
  if (local_1f9 == false) {
    local_1f8.curr = &local_18;
    local_1f8.this = this;
    std::
    function<wasm::CallIndirect*(std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>&,wasm::Type)>
    ::
    function<wasm::I64ToI32Lowering::visitCallIndirect(wasm::CallIndirect*)::_lambda(std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>&,wasm::Type)_1_,void>
              ((function<wasm::CallIndirect*(std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>&,wasm::Type)>
                *)&local_1e8,&local_1f8);
    visitGenericCall<wasm::CallIndirect>(this,curr_00,&local_1e8);
    std::
    function<wasm::CallIndirect_*(std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_&,_wasm::Type)>
    ::~function(&local_1e8);
    return;
  }
  Fatal::Fatal(&local_1b8);
  Fatal::operator<<(&local_1b8,
                    (char (*) [62])"i64 to i32 lowering of return_call values not yet implemented");
  Fatal::~Fatal(&local_1b8);
}

Assistant:

void visitCallIndirect(CallIndirect* curr) {
    if (curr->isReturn && curr->heapType.getSignature().results == Type::i64) {
      Fatal()
        << "i64 to i32 lowering of return_call values not yet implemented";
    }
    visitGenericCall<CallIndirect>(
      curr, [&](std::vector<Expression*>& args, Type results) {
        std::vector<Type> params;
        for (const auto& param : curr->heapType.getSignature().params) {
          if (param == Type::i64) {
            params.push_back(Type::i32);
            params.push_back(Type::i32);
          } else {
            params.push_back(param);
          }
        }
        return builder->makeCallIndirect(curr->table,
                                         curr->target,
                                         args,
                                         Signature(Type(params), results),
                                         curr->isReturn);
      });
  }